

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListTest_move_constructor_Test::TestBody(IntrusiveListTest_move_constructor_Test *this)

{
  vector<int,_std::allocator<int>_> *data_values;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *expected_00;
  TestObjectList local_98;
  undefined8 local_74;
  undefined4 local_6c;
  intrusive_list<(anonymous_namespace)::TestObject> local_68;
  TestObjectList list1;
  
  local_98.first_ = (TestObject *)0x200000001;
  local_98.last_ = (TestObject *)CONCAT44(local_98.last_._4_4_,3);
  local_68.first_ = (TestObject *)0x0;
  local_68.last_ = (TestObject *)0x0;
  local_68.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_68,&local_98);
  anon_unknown.dwarf_633d3::IntrusiveListTest::NewList
            (&list1,(IntrusiveListTest *)&local_68,data_values);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_68);
  local_68.first_ = list1.first_;
  local_68.last_ = list1.last_;
  local_68.size_ = list1.size_;
  list1.first_ = (TestObject *)0x0;
  list1.last_ = (TestObject *)0x0;
  list1.size_ = 0;
  local_98.first_ = (TestObject *)0x0;
  local_98.last_ = (TestObject *)0x0;
  local_98.size_ = 0;
  anon_unknown.dwarf_633d3::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list1,&local_98,expected);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_98);
  local_74 = 0x200000001;
  local_98.first_ = (TestObject *)0x0;
  local_98.last_ = (TestObject *)0x0;
  local_98.size_ = 0;
  local_6c = 3;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_98,&local_74);
  anon_unknown.dwarf_633d3::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_68,&local_98,expected_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_98);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&local_68);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list1);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, move_constructor) {
  TestObjectList list1 = NewList({1, 2, 3});
  TestObjectList list2(std::move(list1));
  AssertListEq(list1, {});
  AssertListEq(list2, {1, 2, 3});
}